

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test::testBody
          (TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test *this)

{
  TeamCityTestOutput *pTVar1;
  UtestShell *pUVar2;
  SimpleString *this_00;
  char *pcVar3;
  TestTerminator *pTVar4;
  char *expected;
  SimpleString local_88;
  undefined1 local_78 [8];
  TestFailure fail;
  TEST_TeamCityOutputTest_TestNameEscaped_Fail_Test *this_local;
  
  fail.message_.bufferSize_ = (size_t)this;
  UtestShell::setTestName((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tst,"\'[]\n\r");
  pUVar2 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tst;
  SimpleString::SimpleString(&local_88,"failure message");
  TestFailure::TestFailure((TestFailure *)local_78,pUVar2,"failfile",0x14,&local_88);
  SimpleString::~SimpleString(&local_88);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tcout;
  (*(pTVar1->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xf])(pTVar1,local_78);
  pUVar2 = UtestShell::getCurrent();
  this_00 = TeamCityOutputToBuffer::getOutput
                      ((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).mock);
  pcVar3 = SimpleString::asCharString(this_00);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,
             "##teamcity[testFailed name=\'|\'|[|]|n|r\' message=\'TEST failed (file:10): failfile:20\' details=\'failure message\']\n"
             ,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
             ,0xdd,pTVar4);
  TestFailure::~TestFailure((TestFailure *)local_78);
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_Fail)
{
	tst->setTestName("'[]\n\r");
	TestFailure fail(tst, "failfile", 20, "failure message");
	tcout->printFailure(fail);
	const char* expected =
		"##teamcity[testFailed name='|'|[|]|n|r' message='TEST failed (file:10): failfile:20' "
		"details='failure message']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}